

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bac.h
# Opt level: O2

Bac_Man_t * Bac_ManDupUserBoxes(Bac_Man_t *p)

{
  Vec_Int_t *p_00;
  Bac_Man_t *pBVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  Bac_Man_t *pBVar5;
  char *pcVar6;
  Abc_Nam_t *pAVar7;
  Bac_Ntk_t *pBVar8;
  Bac_Ntk_t *pBVar9;
  Bac_Ntk_t *pBVar10;
  long lVar11;
  int iVar12;
  ulong uVar13;
  int Counter;
  uint uVar14;
  int iVar15;
  int iVar16;
  int i;
  long lVar17;
  int local_44;
  Bac_Man_t *local_40;
  long local_38;
  
  uVar14 = p->nNtks;
  lVar17 = 1;
  pBVar5 = (Bac_Man_t *)calloc(1,0x530);
  pcVar6 = Abc_UtilStrsav(p->pName);
  pBVar5->pName = pcVar6;
  pcVar6 = Abc_UtilStrsav(p->pSpec);
  pBVar5->pSpec = pcVar6;
  pAVar7 = Abc_NamRef(p->pStrs);
  pBVar5->pStrs = pAVar7;
  pAVar7 = Abc_NamStart(1000,0x18);
  pBVar5->pMods = pAVar7;
  pBVar5->iRoot = 1;
  pBVar5->nNtks = uVar14;
  pBVar8 = (Bac_Ntk_t *)calloc((long)(int)uVar14 + 1,0xd0);
  pBVar5->pNtks = pBVar8;
  lVar11 = 0;
  uVar13 = 0;
  if (0 < (int)uVar14) {
    uVar13 = (ulong)uVar14;
  }
  for (; uVar13 * 0xd0 - lVar11 != 0; lVar11 = lVar11 + 0xd0) {
    *(Bac_Man_t **)((long)&pBVar8[1].pDesign + lVar11) = pBVar5;
  }
  uVar14 = p->nNtks;
  lVar11 = 0;
  uVar13 = 0;
  if (0 < (int)uVar14) {
    uVar13 = (ulong)uVar14;
  }
  iVar12 = 1;
  for (; local_40 = p, uVar13 * 0xd0 - lVar11 != 0; lVar11 = lVar11 + 0xd0) {
    if (*(int *)((long)&p->pNtks[1].iCopy + lVar11) != -1) {
      __assert_fail("p->iCopy == -1",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/bac/bac.h"
                    ,0xd8,"void Bac_NtkSetCopy(Bac_Ntk_t *, int)");
    }
    *(int *)((long)&p->pNtks[1].iCopy + lVar11) = iVar12;
    iVar12 = iVar12 + 1;
  }
  do {
    pBVar1 = local_40;
    if ((int)uVar14 < lVar17) {
      lVar17 = 1;
      lVar11 = 0xd0;
      do {
        if ((int)uVar14 < lVar17) {
          return pBVar5;
        }
        pBVar8 = pBVar1->pNtks;
        pBVar10 = Bac_NtkHostNtk((Bac_Ntk_t *)((long)&pBVar8->pDesign + lVar11));
        if (pBVar10 != (Bac_Ntk_t *)0x0) {
          iVar12 = *(int *)((long)&pBVar8->iCopy + lVar11);
          if (((long)iVar12 < 1) || (pBVar5->nNtks < iVar12)) {
            pBVar9 = (Bac_Ntk_t *)0x0;
          }
          else {
            pBVar9 = pBVar5->pNtks + iVar12;
          }
          iVar12 = pBVar10->iCopy;
          iVar3 = Vec_IntEntry(&pBVar10->vCopy,*(int *)((long)&pBVar8->iBoxObj + lVar11));
          if (pBVar9->iBoxNtk != -1) {
            __assert_fail("p->iBoxNtk == -1",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/bac/bac.h"
                          ,0xee,"void Bac_NtkSetHost(Bac_Ntk_t *, int, int)");
          }
          pBVar9->iBoxNtk = iVar12;
          pBVar9->iBoxObj = iVar3;
          uVar14 = pBVar1->nNtks;
        }
        lVar17 = lVar17 + 1;
        lVar11 = lVar11 + 0xd0;
      } while( true );
    }
    pBVar8 = local_40->pNtks + lVar17;
    iVar12 = local_40->pNtks[lVar17].iCopy;
    local_38 = lVar17;
    if (((long)iVar12 < 1) || (pBVar5->nNtks < iVar12)) {
      pBVar10 = (Bac_Ntk_t *)0x0;
    }
    else {
      pBVar10 = pBVar5->pNtks + iVar12;
      if (pBVar10 == pBVar8) {
        __assert_fail("pNew != p",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/bac/bac.h"
                      ,0x242,"void Bac_NtkDupUserBoxes(Bac_Ntk_t *, Bac_Ntk_t *)");
      }
    }
    iVar12 = pBVar8->NameId;
    iVar3 = (pBVar8->vInputs).nSize;
    iVar4 = (pBVar8->vOutputs).nSize;
    iVar16 = (pBVar8->vType).nSize;
    iVar15 = 0;
    iVar2 = iVar16;
    for (lVar17 = 0; lVar17 < iVar2; lVar17 = lVar17 + 1) {
      iVar2 = Abc_Lit2Var((int)(pBVar8->vType).pArray[lVar17]);
      iVar15 = iVar15 + (uint)(iVar2 == 3);
      iVar2 = (pBVar8->vType).nSize;
    }
    if (pBVar10->pDesign == (Bac_Man_t *)0x0) {
      __assert_fail("pNew->pDesign != NULL",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/bac/bac.h"
                    ,0x218,"void Bac_NtkAlloc(Bac_Ntk_t *, int, int, int, int)");
    }
    if ((pBVar10->vInputs).nSize != 0) {
      __assert_fail("Bac_NtkPiNum(pNew) == 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/bac/bac.h"
                    ,0x219,"void Bac_NtkAlloc(Bac_Ntk_t *, int, int, int, int)");
    }
    if ((pBVar10->vOutputs).nSize != 0) {
      __assert_fail("Bac_NtkPoNum(pNew) == 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/bac/bac.h"
                    ,0x21a,"void Bac_NtkAlloc(Bac_Ntk_t *, int, int, int, int)");
    }
    iVar16 = (iVar15 + iVar4) * 3 + iVar16;
    pBVar10->NameId = iVar12;
    pBVar10->iCopy = -1;
    pBVar10->iBoxNtk = -1;
    pBVar10->iBoxObj = -1;
    Vec_IntGrow(&pBVar10->vInputs,iVar3);
    Vec_IntGrow(&pBVar10->vOutputs,iVar4);
    Vec_StrGrow(&pBVar10->vType,iVar16);
    Vec_IntGrow(&pBVar10->vFanin,iVar16);
    pAVar7 = pBVar10->pDesign->pMods;
    pcVar6 = Bac_NtkStr(pBVar10,iVar12);
    iVar3 = Abc_NamStrFindOrAdd(pAVar7,pcVar6,&local_44);
    if (local_44 == 0) {
      iVar12 = Bac_NtkId(pBVar10);
      if (iVar3 != iVar12) {
        __assert_fail("NtkId == Bac_NtkId(pNew)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/bac/bac.h"
                      ,0x228,"void Bac_NtkAlloc(Bac_Ntk_t *, int, int, int, int)");
      }
    }
    else {
      pcVar6 = Bac_NtkStr(pBVar10,iVar12);
      printf("Network with name %s already exists.\n",pcVar6);
    }
    if ((pBVar8->vInfo).nSize != 0) {
      Vec_IntAppend(&pBVar10->vInfo,&pBVar8->vInfo);
    }
    Bac_NtkStartCopies(pBVar8);
    for (iVar12 = 0; iVar12 < (pBVar8->vInputs).nSize; iVar12 = iVar12 + 1) {
      iVar3 = Vec_IntEntry(&pBVar8->vInputs,iVar12);
      Bac_ObjDup(pBVar10,pBVar8,iVar3);
    }
    for (iVar12 = 0; iVar12 < (pBVar8->vOutputs).nSize; iVar12 = iVar12 + 1) {
      iVar3 = Vec_IntEntry(&pBVar8->vOutputs,iVar12);
      Bac_ObjDup(pBVar10,pBVar8,iVar3);
    }
    iVar12 = 1;
    for (iVar3 = 0; lVar17 = local_38, iVar4 = (pBVar8->vType).nSize, iVar3 < iVar4;
        iVar3 = iVar3 + 1) {
      iVar4 = Bac_ObjIsBoxUser(pBVar8,iVar3);
      if (iVar4 != 0) {
        iVar16 = Bac_ObjIsBox(pBVar8,iVar3);
        iVar4 = iVar12;
        if (iVar16 == 0) {
          __assert_fail("Bac_ObjIsBox(p, i)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/bac/bac.h"
                        ,0x130,"int Bac_BoxBiNum(Bac_Ntk_t *, int)");
        }
        do {
          iVar16 = iVar4 + -1;
          if (iVar16 < 1) {
            iVar16 = 0;
            break;
          }
          iVar2 = Bac_ObjIsBi(pBVar8,iVar4 + -2);
          iVar4 = iVar16;
        } while (iVar2 != 0);
        while (iVar4 = Bac_ObjIsBi(pBVar8,iVar16), iVar4 != 0) {
          Bac_ObjDup(pBVar10,pBVar8,iVar16);
          iVar16 = iVar16 + 1;
        }
        iVar4 = Bac_ObjDup(pBVar10,pBVar8,iVar3);
        if ((((pBVar8->vName).pArray != (int *)0x0) && ((pBVar10->vName).pArray != (int *)0x0)) &&
           (iVar16 = Bac_ObjName(pBVar8,iVar3), iVar16 != 0)) {
          iVar16 = Bac_ObjName(pBVar8,iVar3);
          Bac_ObjSetName(pBVar10,iVar4,iVar16);
        }
        pBVar9 = Bac_BoxNtk(pBVar8,iVar3);
        iVar16 = iVar12;
        if (pBVar9 != (Bac_Ntk_t *)0x0) {
          pBVar9 = Bac_BoxNtk(pBVar8,iVar3);
          iVar2 = pBVar9->iCopy;
          iVar15 = Bac_ObjIsBox(pBVar10,iVar4);
          if (((iVar2 < 1) || (iVar15 == 0)) || (pBVar10->pDesign->nNtks < iVar2)) {
            __assert_fail("Bac_ObjIsBox(p, i)&&Bac_ManNtkIsOk(p->pDesign, x)",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/bac/bac.h"
                          ,0x13e,"void Bac_BoxSetNtkId(Bac_Ntk_t *, int, int)");
          }
          Vec_IntSetEntry(&pBVar10->vFanin,iVar4,iVar2);
        }
        while ((iVar16 < (pBVar8->vType).nSize && (iVar4 = Bac_ObjIsBo(pBVar8,iVar16), iVar4 != 0)))
        {
          Bac_ObjDup(pBVar10,pBVar8,iVar16);
          iVar16 = iVar16 + 1;
        }
      }
      iVar12 = iVar12 + 1;
    }
    p_00 = &pBVar8->vCopy;
    for (iVar12 = 0; iVar12 < iVar4; iVar12 = iVar12 + 1) {
      iVar3 = Bac_ObjIsCo(pBVar8,iVar12);
      if ((iVar3 != 0) && (iVar3 = Vec_IntEntry(p_00,iVar12), -1 < iVar3)) {
        iVar3 = Bac_ObjFanin(pBVar8,iVar12);
        iVar3 = Vec_IntEntry(p_00,iVar3);
        if (-1 < iVar3) {
          iVar3 = Vec_IntEntry(p_00,iVar12);
          iVar4 = Bac_ObjFanin(pBVar8,iVar12);
          iVar4 = Vec_IntEntry(p_00,iVar4);
          Bac_ObjSetFanin(pBVar10,iVar3,iVar4);
        }
      }
      iVar4 = (pBVar8->vType).nSize;
    }
    lVar17 = lVar17 + 1;
    uVar14 = local_40->nNtks;
  } while( true );
}

Assistant:

static inline Bac_Man_t * Bac_ManDupUserBoxes( Bac_Man_t * p )
{
    Bac_Ntk_t * pNtk, * pHost; int i;
    Bac_Man_t * pNew = Bac_ManStart( p, Bac_ManNtkNum(p) );
    Bac_ManForEachNtk( p, pNtk, i )
        Bac_NtkSetCopy( pNtk, i );
    Bac_ManForEachNtk( p, pNtk, i )
        Bac_NtkDupUserBoxes( Bac_NtkCopyNtk(pNew, pNtk), pNtk );
    Bac_ManForEachNtk( p, pNtk, i )
        if ( (pHost = Bac_NtkHostNtk(pNtk)) )
            Bac_NtkSetHost( Bac_NtkCopyNtk(pNew, pNtk), Bac_NtkCopy(pHost), Bac_ObjCopy(pHost, Bac_NtkHostObj(pNtk)) );
    return pNew;
}